

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::Company(Company *this,Company *obj)

{
  uint uVar1;
  int iVar2;
  Boss *this_00;
  Employee **ppEVar3;
  Employee *this_01;
  ulong uVar4;
  long lVar5;
  
  this->budget = obj->budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,obj->boss);
  this->boss = this_00;
  uVar1 = Boss::getNumberOfEmployees(obj->boss);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)uVar1) {
    uVar4 = (ulong)uVar1 << 3;
  }
  ppEVar3 = (Employee **)operator_new__(uVar4);
  this->employees = ppEVar3;
  lVar5 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(obj->boss);
    if (iVar2 <= lVar5) break;
    this_01 = (Employee *)operator_new(0xb8);
    Employee::Employee(this_01,obj->employees[lVar5]);
    this->employees[lVar5] = this_01;
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

Company::Company(const Company &obj) {
    this->budget = obj.budget;
    this->boss = new Boss(*obj.boss);
    this->employees = new Employee *[obj.boss->getNumberOfEmployees()];
    for (int i = 0; i < obj.boss->getNumberOfEmployees(); ++i) {
        this->employees[i] = new Employee(*obj.employees[i]);
    }
}